

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LocalSingleStoreElimPass::FeedsAStore
          (LocalSingleStoreElimPass *this,Instruction *inst)

{
  DefUseManager *def;
  bool bVar1;
  IRContext *this_00;
  DefUseManager *this_01;
  anon_class_8_1_8991fb9c local_48;
  function<bool_(spvtools::opt::Instruction_*)> local_40;
  DefUseManager *local_20;
  DefUseManager *def_use_mgr;
  Instruction *inst_local;
  LocalSingleStoreElimPass *this_local;
  
  def_use_mgr = (DefUseManager *)inst;
  inst_local = (Instruction *)this;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  def = def_use_mgr;
  local_48.this = this;
  local_20 = this_01;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LocalSingleStoreElimPass::FeedsAStore(spvtools::opt::Instruction*)const::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_40,&local_48);
  bVar1 = analysis::DefUseManager::WhileEachUser(this_01,(Instruction *)def,&local_40);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool LocalSingleStoreElimPass::FeedsAStore(Instruction* inst) const {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  return !def_use_mgr->WhileEachUser(inst, [this](Instruction* user) {
    switch (user->opcode()) {
      case spv::Op::OpStore:
        return false;
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
      case spv::Op::OpCopyObject:
        return !FeedsAStore(user);
      case spv::Op::OpLoad:
      case spv::Op::OpImageTexelPointer:
      case spv::Op::OpName:
        return true;
      default:
        // Don't know if this instruction modifies the variable.
        // Conservatively assume it is a store.
        return user->IsDecoration();
    }
  });
}